

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::doRun
          (ExplicitUniformLocationCaseBase *this,
          vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          *uniforms,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms,string *additionalDef,bool negativeCompile,bool negativeLink)

{
  CallLogWrapper *this_00;
  _Link_type __x;
  Loc *this_01;
  GLsizei width;
  pointer pUVar1;
  pointer puVar2;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar3;
  undefined1 auVar4 [16];
  TestLog *this_02;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  GLuint GVar8;
  ContextType type;
  uint uVar9;
  GLint GVar10;
  GLint GVar11;
  ostream *poVar12;
  iterator iVar13;
  iterator iVar14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  long lVar17;
  pointer __result;
  pointer pCVar18;
  SubroutineFunction *this_03;
  float *pfVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  iterator iVar20;
  _Rb_tree_header *p_Var21;
  char *pcVar22;
  ShaderKey *pSVar23;
  _Tp_alloc_type *__alloc;
  GLenum programInterface;
  allocator_type *__a;
  allocator_type *__a_00;
  ShaderKey *__y;
  ShaderKey *__y_00;
  ShaderKey *__y_01;
  iterator iVar24;
  iterator iVar25;
  CompiledProgram *pCVar26;
  CompiledProgram *extraout_RDX;
  size_t __n;
  allocator<glcts::(anonymous_namespace)::CompiledProgram> *extraout_RDX_00;
  allocator<glcts::(anonymous_namespace)::CompiledProgram> *paVar27;
  allocator<glcts::(anonymous_namespace)::CompiledProgram> *extraout_RDX_01;
  _Self __tmp_2;
  ShaderKey *__y_02;
  pointer pvVar28;
  ulong uVar29;
  pointer pCVar30;
  byte bVar31;
  GLenum GVar32;
  GLuint GVar33;
  ulong uVar34;
  pointer pSVar35;
  _Link_type __p;
  char (*pacVar36) [9];
  CompiledProgram *pCVar37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar38;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *t;
  char (*pacVar39) [5];
  char (*pacVar40) [2];
  char (*pacVar41) [7];
  char (*pacVar42) [17];
  char (*pacVar43) [51];
  string *psVar44;
  pointer pCVar45;
  int iVar46;
  int iVar47;
  size_t fn;
  _Link_type this_04;
  _Self __tmp;
  string *psVar48;
  pointer pSVar49;
  _Self __tmp_1;
  long lVar50;
  pointer pCVar51;
  ulong uVar52;
  ulong uVar53;
  LayoutSpecifierBase *pLVar54;
  undefined1 auVar55 [16];
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar56;
  char *local_16e8;
  GLint numactive;
  pointer local_16d0;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *local_16c8;
  string *local_16c0;
  GLint returned;
  GLint returned_1;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  *local_16b0;
  ulong local_16a8;
  ExplicitUniformLocationCaseBase *local_16a0;
  ulong local_1698;
  string *local_1690;
  string *local_1688;
  GLint expected_1;
  GLint returnedPIQ;
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  programConfigs;
  map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
  shaders;
  GLuint vao;
  GLuint vbo;
  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  programs;
  GLint status;
  ulong local_15e8;
  ulong local_15e0;
  int local_15d8;
  GLint maxIndex;
  GLint maxLocation;
  GLint expected;
  ulong local_15c8;
  ulong local_15c0;
  LayoutSpecifierBase *local_15b8;
  DefOccurence *local_15b0;
  string parentUniformName;
  GLint status_1;
  undefined1 local_1580 [24];
  _Base_ptr local_1568;
  size_t local_1560;
  GLfloat coords [16];
  ostringstream name_1;
  ostringstream name;
  
  local_16c8 = subroutineUniforms;
  local_16b0 = uniforms;
  local_16a0 = this;
  local_1690 = additionalDef;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parentUniformName,fixed_sample_locations_values + 1,(allocator<char> *)&name
            );
  lVar50 = 0;
  for (uVar34 = 0;
      uVar34 < (ulong)(((long)(local_16b0->
                              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_16b0->
                             super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x1d8);
      uVar34 = uVar34 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    poVar12 = std::operator<<((ostream *)&name,"u");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    pUVar1 = (local_16b0->
             super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::stringbuf::str();
    anon_unknown_0::Uniform::setName
              ((Uniform *)((long)&(pUVar1->type).enumType + lVar50),&parentUniformName,
               (string *)&name_1);
    std::__cxx11::string::~string((string *)&name_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    lVar50 = lVar50 + 0x1d8;
  }
  psVar44 = (string *)0x0;
  iVar46 = 0;
  for (pSVar35 = (pointer)0x0;
      pSVar35 < (pointer)(((long)(local_16c8->
                                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_16c8->
                                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                )._M_impl.super__Vector_impl_data._M_start) / 0x168);
      pSVar35 = (pointer)((long)&(pSVar35->functions).fn.
                                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_1);
    poVar12 = std::operator<<((ostream *)&name_1,"u");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    pSVar49 = (local_16c8->
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&pSVar49[(long)pSVar35].name);
    std::__cxx11::string::~string((string *)&name);
    pSVar49 = (local_16c8->
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pSVar49[(long)pSVar35].functions.typeName._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      poVar12 = std::operator<<((ostream *)&name,"st");
      std::ostream::operator<<(poVar12,(int)psVar44);
      local_16d0 = pSVar35;
      std::__cxx11::stringbuf::str();
      local_16c0 = (string *)(ulong)((int)psVar44 + 1);
      std::__cxx11::string::operator=
                ((string *)&pSVar49[(long)pSVar35].functions.typeName,(string *)&status_1);
      std::__cxx11::string::~string((string *)&status_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      lVar50 = 0xe8;
      uVar34 = 0;
      while( true ) {
        pSVar49 = (local_16c8->
                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar17 = *(long *)&pSVar49[(long)pSVar35].functions.fn.
                           super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
        ;
        if ((ulong)(((long)pSVar49[(long)pSVar35].functions.fn.
                           super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar17) / 0x108) <= uVar34)
        break;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        poVar12 = std::operator<<((ostream *)&name,"sf");
        std::ostream::operator<<(poVar12,iVar46 + (int)uVar34);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)(lVar17 + lVar50),(string *)&status_1);
        std::__cxx11::string::~string((string *)&status_1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        uVar34 = uVar34 + 1;
        lVar50 = lVar50 + 0x108;
      }
      iVar46 = iVar46 + (int)uVar34;
      pSVar35 = local_16d0;
      psVar44 = local_16c0;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_1);
  }
  coords[0xc] = -1.0;
  coords[0xd] = 1.0;
  coords[0xe] = 0.0;
  coords[0xf] = 1.0;
  coords[8] = -1.0;
  coords[9] = -1.0;
  coords[10] = 0.0;
  coords[0xb] = 1.0;
  coords[4] = 1.0;
  coords[5] = 1.0;
  coords[6] = 0.0;
  coords[7] = 1.0;
  coords[0] = 1.0;
  coords[1] = -1.0;
  coords[2] = 0.0;
  coords[3] = 1.0;
  this_00 = &(local_16a0->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&vbo);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,coords,0x88e4);
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&vao);
  glu::CallLogWrapper::glBindVertexArray(this_00,vao);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
            *)&shaders,2,__a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_1,fixed_sample_locations_values + 1,(allocator<char> *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status_1,"vs_ValidationResult",(allocator<char> *)&numactive);
  ShaderKey::ShaderKey((ShaderKey *)&name,0x8b31,(string *)&name_1,(string *)&status_1);
  pSVar23 = (ShaderKey *)CONCAT44(shaders._M_t._M_impl._4_4_,shaders._M_t._M_impl._0_4_);
  ShaderKey::operator=(pSVar23,(ShaderKey *)&name);
  ShaderKey::~ShaderKey((ShaderKey *)&name);
  std::__cxx11::string::~string((string *)&status_1);
  std::__cxx11::string::~string((string *)&name_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_1,"vs_ValidationResult",(allocator<char> *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status_1,fixed_sample_locations_values + 1,(allocator<char> *)&numactive);
  ShaderKey::ShaderKey((ShaderKey *)&name,0x8b30,(string *)&name_1,(string *)&status_1);
  ShaderKey::operator=(pSVar23 + 1,(ShaderKey *)&name);
  ShaderKey::~ShaderKey((ShaderKey *)&name);
  std::__cxx11::string::~string((string *)&status_1);
  std::__cxx11::string::~string((string *)&name_1);
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::push_back(&programConfigs,(value_type *)&shaders);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::~vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
             *)&shaders);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
            *)&shaders,1,__a_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_1,fixed_sample_locations_values + 1,(allocator<char> *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status_1,fixed_sample_locations_values + 1,(allocator<char> *)&numactive);
  ShaderKey::ShaderKey((ShaderKey *)&name,0x91b9,(string *)&name_1,(string *)&status_1);
  ShaderKey::operator=
            ((ShaderKey *)CONCAT44(shaders._M_t._M_impl._4_4_,shaders._M_t._M_impl._0_4_),
             (ShaderKey *)&name);
  ShaderKey::~ShaderKey((ShaderKey *)&name);
  std::__cxx11::string::~string((string *)&status_1);
  std::__cxx11::string::~string((string *)&name_1);
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::push_back(&programConfigs,(value_type *)&shaders);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::~vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
             *)&shaders);
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar34 = 0;
  psVar44 = (string *)
            programConfigs.
            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar48 = (string *)
            programConfigs.
            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pvVar28 = programConfigs.
                   super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        p_Var15 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        uVar34 < (ulong)(((long)programConfigs.
                                super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar48) / 0x18))
  {
    local_16c0 = (string *)(uVar34 * 0x18);
    local_16e8 = (char *)0x0;
    local_15e0 = uVar34;
    for (pSVar35 = (pointer)0x0;
        pSVar35 < (pointer)((*(long *)(psVar48 + 8 + (long)local_16c0) -
                            *(long *)(psVar48 + (long)local_16c0)) / 0x48);
        pSVar35 = (pointer)((long)&(pSVar35->functions).fn.
                                   super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1)) {
      local_16d0 = pSVar35;
      iVar13 = std::
               map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
               ::find(&shaders,(key_type *)(local_16e8 + *(long *)(psVar48 + (long)local_16c0)));
      psVar5 = local_16c0;
      p_Var21 = &shaders._M_t._M_impl.super__Rb_tree_header;
      pSVar35 = local_16d0;
      if ((_Rb_tree_header *)iVar13._M_node == p_Var21) {
        GVar8 = glu::CallLogWrapper::glCreateShader
                          (this_00,*(GLenum *)(local_16e8 + *(long *)(psVar44 + (long)local_16c0)));
        local_16a8 = CONCAT44(local_16a8._4_4_,GVar8);
        lVar50 = *(long *)(psVar44 + (long)psVar5);
        local_1688 = psVar48;
        type.super_ApiType.m_bits =
             (ApiType)(*((local_16a0->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                        _vptr_RenderContext[2])();
        iVar46 = *(int *)(local_16e8 + lVar50);
        if (iVar46 == 0x8b30) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          ShaderSourceFactory::streamShaderHeader(&name,type);
          std::operator<<((ostream *)&name,"\n");
          ShaderSourceFactory::streamUniformDefinitions(local_16b0,0x8b30,&name);
          std::operator<<((ostream *)&name,"\n");
          ShaderSourceFactory::streamSubroutineDefinitions(local_16c8,0x8b30,&name);
          poVar12 = std::operator<<((ostream *)&name,"\n");
          poVar12 = std::operator<<(poVar12,(string *)local_1690);
          poVar12 = std::operator<<(poVar12,"\nin vec4 ");
          pcVar22 = local_16e8;
          poVar12 = std::operator<<(poVar12,(string *)(local_16e8 + lVar50 + 8));
          poVar12 = std::operator<<(poVar12,";");
          poVar12 = std::operator<<(poVar12,"\nout vec4 out_FragColor;");
          poVar12 = std::operator<<(poVar12,"\nvoid main() {");
          poVar12 = std::operator<<(poVar12,"\n    vec4 validationResult = ");
          poVar12 = std::operator<<(poVar12,(string *)(local_16e8 + lVar50 + 8));
          poVar12 = std::operator<<(poVar12,";");
          std::operator<<(poVar12,"\n");
          ShaderSourceFactory::streamUniformValidators(&name,local_16b0,0x8b30,pcVar22);
          std::operator<<((ostream *)&name,"\n");
          ShaderSourceFactory::streamSubroutineValidators(&name,local_16c8,0x8b30,pcVar22);
          poVar12 = std::operator<<((ostream *)&name,"\n    out_FragColor =  validationResult;");
          std::operator<<(poVar12,"\n}");
          std::__cxx11::stringbuf::str();
        }
        else if (iVar46 == 0x91b9) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          ShaderSourceFactory::streamShaderHeader(&name,type);
          poVar12 = std::operator<<((ostream *)&name,
                                    "\nlayout (local_size_x = 1, local_size_y = 1) in;");
          poVar12 = std::operator<<(poVar12,"\nlayout (std430, binding = 1) buffer ResultBuffer {");
          poVar12 = std::operator<<(poVar12,"\n    vec4 cs_ValidationResult;");
          poVar12 = std::operator<<(poVar12,"\n};");
          std::operator<<(poVar12,"\n");
          ShaderSourceFactory::streamUniformDefinitions(local_16b0,0x91b9,&name);
          std::operator<<((ostream *)&name,"\n");
          ShaderSourceFactory::streamSubroutineDefinitions(local_16c8,0x91b9,&name);
          poVar12 = std::operator<<((ostream *)&name,"\n");
          poVar12 = std::operator<<(poVar12,(string *)local_1690);
          poVar12 = std::operator<<(poVar12,"\nvoid main() {");
          poVar12 = std::operator<<(poVar12,
                                    "\n    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);");
          std::operator<<(poVar12,"\n");
          ShaderSourceFactory::streamUniformValidators(&name,local_16b0,0x91b9,(char *)p_Var21);
          std::operator<<((ostream *)&name,"\n");
          ShaderSourceFactory::streamSubroutineValidators(&name,local_16c8,0x91b9,(char *)p_Var21);
          poVar12 = std::operator<<((ostream *)&name,
                                    "\n    cs_ValidationResult =  validationResult;");
          std::operator<<(poVar12,"\n}");
          std::__cxx11::stringbuf::str();
        }
        else {
          if (iVar46 != 0x8b31) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                          ,0x4b4,
                          "static std::string glcts::(anonymous namespace)::ShaderSourceFactory::generateShader(const ShaderKey &, const std::vector<Uniform> &, const std::vector<SubroutineUniform> &, const std::string &, const glu::ContextType)"
                         );
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          ShaderSourceFactory::streamShaderHeader(&name,type);
          std::operator<<((ostream *)&name,"\n");
          ShaderSourceFactory::streamUniformDefinitions(local_16b0,0x8b31,&name);
          std::operator<<((ostream *)&name,"\n");
          ShaderSourceFactory::streamSubroutineDefinitions(local_16c8,0x8b31,&name);
          poVar12 = std::operator<<((ostream *)&name,"\n");
          poVar12 = std::operator<<(poVar12,(string *)local_1690);
          poVar12 = std::operator<<(poVar12,"\nin vec4 in_Position;");
          poVar12 = std::operator<<(poVar12,"\nout vec4 ");
          pcVar22 = local_16e8;
          poVar12 = std::operator<<(poVar12,(string *)(local_16e8 + lVar50 + 0x28));
          poVar12 = std::operator<<(poVar12,";");
          poVar12 = std::operator<<(poVar12,"\nvoid main() {");
          poVar12 = std::operator<<(poVar12,
                                    "\n    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);");
          std::operator<<(poVar12,"\n");
          ShaderSourceFactory::streamUniformValidators(&name,local_16b0,0x8b31,pcVar22);
          std::operator<<((ostream *)&name,"\n");
          ShaderSourceFactory::streamSubroutineValidators(&name,local_16c8,0x8b31,pcVar22);
          poVar12 = std::operator<<((ostream *)&name,"\n    ");
          poVar12 = std::operator<<(poVar12,(string *)(local_16e8 + lVar50 + 0x28));
          poVar12 = std::operator<<(poVar12," = validationResult;");
          poVar12 = std::operator<<(poVar12,"\n    gl_Position = in_Position;");
          std::operator<<(poVar12,"\n}");
          std::__cxx11::stringbuf::str();
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT44(name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _4_4_,(GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream);
        pSVar23 = (ShaderKey *)&name;
        glu::CallLogWrapper::glShaderSource
                  (this_00,(GLuint)local_16a8,1,(GLchar **)&name,(GLint *)0x0);
        __y_02 = (ShaderKey *)(local_16e8 + *(long *)(psVar44 + (long)psVar5));
        p_Var21 = &shaders._M_t._M_impl.super__Rb_tree_header;
        iVar14 = std::
                 _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                 ::_M_lower_bound((_Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                                   *)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                                  (_Link_type)p_Var21,(_Base_ptr)__y_02,pSVar23);
        pVar3.second = iVar14._M_node;
        pVar3.first = iVar14._M_node;
        if (((_Rb_tree_header *)iVar14._M_node == p_Var21) ||
           (bVar6 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                              ((less<glcts::(anonymous_namespace)::ShaderKey> *)__y_02,
                               (ShaderKey *)(iVar14._M_node + 1),__y), psVar48 = local_1688,
           pSVar35 = local_16d0, bVar6)) {
          p_Var15 = (_Rb_tree_node_base *)operator_new(0x70);
          this_04 = (_Link_type)(p_Var15 + 1);
          ShaderKey::ShaderKey((ShaderKey *)this_04,__y_02);
          *(undefined4 *)&p_Var15[3]._M_parent = 0;
          if ((_Rb_tree_header *)iVar14._M_node == &shaders._M_t._M_impl.super__Rb_tree_header) {
            if ((shaders._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
               (__p = this_04,
               bVar6 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                 ((less<glcts::(anonymous_namespace)::ShaderKey> *)
                                  (shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 1
                                  ),(ShaderKey *)this_04,__y_00), !bVar6)) {
LAB_00bdc095:
              __p = this_04;
              pVar56 = std::
                       _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                       ::_M_get_insert_unique_pos(&shaders._M_t,(key_type *)this_04);
            }
            else {
LAB_00bdc08e:
              auVar55._8_8_ = 0;
              auVar55._0_8_ = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              pVar56 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar55 << 0x40)
              ;
            }
LAB_00bdc0a8:
            iVar25._M_node = pVar56.second;
            iVar14._M_node = pVar56.first;
            if (iVar25._M_node == (_Rb_tree_node_base *)0x0) {
LAB_00bdc0da:
              std::
              _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
              ::_M_drop_node((_Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                              *)p_Var15,__p);
              psVar48 = local_1688;
              pSVar35 = local_16d0;
              goto LAB_00bdc121;
            }
          }
          else {
            __x = (_Link_type)(iVar14._M_node + 1);
            __p = __x;
            bVar6 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                              ((less<glcts::(anonymous_namespace)::ShaderKey> *)this_04,
                               (ShaderKey *)__x,__y_00);
            if (!bVar6) {
              __p = this_04;
              bVar6 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x,
                                 (ShaderKey *)this_04,__y_01);
              if (bVar6) {
                if (shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right == iVar14._M_node)
                goto LAB_00bdc08e;
                auVar55 = std::_Rb_tree_increment(iVar14._M_node);
                iVar24._M_node = auVar55._0_8_;
                pVar56.second = iVar24._M_node;
                pVar56.first = iVar24._M_node;
                __p = (_Link_type)(iVar24._M_node + 1);
                bVar6 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                  ((less<glcts::(anonymous_namespace)::ShaderKey> *)this_04,
                                   (ShaderKey *)__p,auVar55._8_8_);
                if (!bVar6) goto LAB_00bdc095;
                iVar25 = iVar14;
                if ((iVar14._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_00bdc087;
                goto LAB_00bdc0a8;
              }
              goto LAB_00bdc0da;
            }
            pVar56.second = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pVar56.first = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left == iVar14._M_node)
            goto LAB_00bdc0a8;
            auVar55 = std::_Rb_tree_decrement(iVar14._M_node);
            iVar25._M_node = auVar55._0_8_;
            __p = this_04;
            bVar6 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                              ((less<glcts::(anonymous_namespace)::ShaderKey> *)(iVar25._M_node + 1)
                               ,(ShaderKey *)this_04,auVar55._8_8_);
            if (!bVar6) goto LAB_00bdc095;
            iVar24 = iVar14;
            pVar56 = pVar3;
            if ((iVar25._M_node)->_M_right != (_Base_ptr)0x0) goto LAB_00bdc0a8;
LAB_00bdc087:
            auVar4._8_8_ = 0;
            auVar4._0_8_ = iVar24._M_node;
            pVar56 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar4 << 0x40);
          }
          pSVar35 = local_16d0;
          bVar6 = true;
          if ((&shaders._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)iVar25._M_node) &&
             (pVar56.first == (_Rb_tree_node_base *)0x0)) {
            bVar6 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                              ((less<glcts::(anonymous_namespace)::ShaderKey> *)this_04,
                               (ShaderKey *)(iVar25._M_node + 1),(ShaderKey *)pVar56.second);
          }
          std::_Rb_tree_insert_and_rebalance
                    (bVar6,p_Var15,iVar25._M_node,
                     &shaders._M_t._M_impl.super__Rb_tree_header._M_header);
          shaders._M_t._M_impl.super__Rb_tree_header._M_node_count =
               shaders._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
          iVar14._M_node = p_Var15;
          psVar48 = (string *)
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
LAB_00bdc121:
        *(GLuint *)&iVar14._M_node[3]._M_parent = (GLuint)local_16a8;
        std::__cxx11::string::~string((string *)&name_1);
      }
      psVar44 = psVar48;
      local_16e8 = local_16e8 + 0x48;
      psVar48 = psVar44;
    }
    uVar34 = local_15e0 + 1;
  }
  for (; (_Rb_tree_header *)p_Var15 != &shaders._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    glu::CallLogWrapper::glCompileShader(this_00,*(GLuint *)&p_Var15[3]._M_parent);
  }
  local_1698 = 0;
  for (p_Var16 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left; uVar34 = local_1698,
      (_Rb_tree_header *)p_Var16 != &shaders._M_t._M_impl.super__Rb_tree_header;
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
    glu::CallLogWrapper::glGetShaderiv(this_00,*(GLuint *)&p_Var16[3]._M_parent,0x8b81,&status);
    glu::CallLogWrapper::glGetShaderSource
              (this_00,*(GLuint *)&p_Var16[3]._M_parent,4000,(GLsizei *)0x0,(GLchar *)&name);
    glu::CallLogWrapper::glGetShaderInfoLog
              (this_00,*(GLuint *)&p_Var16[3]._M_parent,1000,(GLsizei *)0x0,(GLchar *)&name_1);
    tcu::TestLog::writeKernelSource(glcts::(anonymous_namespace)::Logger::s_tcuLog,(char *)&name);
    tcu::TestLog::writeCompileInfo
              (glcts::(anonymous_namespace)::Logger::s_tcuLog,"shader",
               fixed_sample_locations_values + 1,status == 1,(char *)&name_1);
    if (!negativeLink) {
      if (negativeCompile) {
        if (status != 0) {
          Logger::Logger((Logger *)&status_1);
          if ((char)status_1 == '\0') {
            std::operator<<((ostream *)local_1580,
                            "Negative compilation case failed: shader shoult not compile, but GL_COMPILE_STATUS != 0"
                           );
          }
LAB_00bdc2c6:
          Logger::~Logger((Logger *)&status_1);
          local_1698 = 0xffffffffffffffff;
        }
      }
      else if (status != 1) {
        Logger::Logger((Logger *)&status_1);
        if ((char)status_1 == '\0') {
          std::operator<<((ostream *)local_1580,"Shader compilation failed");
        }
        goto LAB_00bdc2c6;
      }
    }
  }
  p_Var15 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (negativeCompile) {
    for (; (_Rb_tree_header *)p_Var15 != &shaders._M_t._M_impl.super__Rb_tree_header;
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      glu::CallLogWrapper::glDeleteShader(this_00,*(GLuint *)&p_Var15[3]._M_parent);
    }
  }
  else {
    for (uVar34 = 0;
        pCVar51 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar52 = ((long)pvVar28 - (long)psVar44) / 0x18,
        pCVar45 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_start, uVar53 = uVar52, uVar34 < uVar52;
        uVar34 = uVar34 + 1) {
      name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
      name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
      GVar8 = glu::CallLogWrapper::glCreateProgram(this_00);
      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                    _4_4_,GVar8);
      psVar44 = psVar44 + uVar34 * 0x18;
      lVar50 = 0;
      uVar53 = 0;
      while( true ) {
        pCVar45 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pCVar51 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = *(long *)(psVar44 + 8) - *(long *)psVar44;
        pCVar26 = (CompiledProgram *)(lVar17 % 0x48);
        if ((ulong)(lVar17 / 0x48) <= uVar53) break;
        iVar13 = std::
                 map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                 ::find(&shaders,(key_type *)(*(long *)psVar44 + lVar50));
        glu::CallLogWrapper::glAttachShader
                  (this_00,(GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream,*(GLuint *)&iVar13._M_node[3]._M_parent);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                   (value_type_conflict4 *)(*(long *)psVar44 + lVar50));
        uVar53 = uVar53 + 1;
        lVar50 = lVar50 + 0x48;
      }
      if (programs.
          super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          programs.
          super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if ((long)programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar52 = (long)programs.
                       super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)programs.
                       super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        uVar53 = uVar52;
        if (programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar53 = 1;
        }
        uVar29 = uVar53 + uVar52;
        __alloc = (_Tp_alloc_type *)0x3ffffffffffffff;
        if (0x3fffffffffffffe < uVar29) {
          uVar29 = 0x3ffffffffffffff;
        }
        if (CARRY8(uVar53,uVar52)) {
          uVar29 = 0x3ffffffffffffff;
        }
        if (uVar29 == 0) {
          __result = (pointer)0x0;
        }
        else {
          __result = (pointer)operator_new(uVar29 << 5);
          pCVar26 = extraout_RDX;
        }
        std::allocator_traits<std::allocator<glcts::(anonymous_namespace)::CompiledProgram>>::
        construct<glcts::(anonymous_namespace)::CompiledProgram,glcts::(anonymous_namespace)::CompiledProgram_const&>
                  ((allocator_type *)(__result + uVar52),(CompiledProgram *)&name,pCVar26);
        pCVar18 = std::
                  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ::_S_relocate(pCVar51,pCVar45,__result,__alloc);
        pCVar18 = std::
                  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ::_S_relocate(pCVar45,pCVar45,pCVar18 + 1,__alloc);
        std::
        _Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
        ::_M_deallocate((_Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                         *)pCVar51,
                        (pointer)((long)programs.
                                        super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pCVar51 >> 5),__n);
        programs.
        super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar29;
        programs.
        super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
        ._M_impl.super__Vector_impl_data._M_start = __result;
        programs.
        super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar18;
      }
      else {
        std::allocator_traits<std::allocator<glcts::(anonymous_namespace)::CompiledProgram>>::
        construct<glcts::(anonymous_namespace)::CompiledProgram,glcts::(anonymous_namespace)::CompiledProgram_const&>
                  ((allocator_type *)
                   programs.
                   super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(CompiledProgram *)&name,pCVar26);
        programs.
        super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar45 + 1;
      }
      glu::CallLogWrapper::glLinkProgram
                (this_00,programs.
                         super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar34].name);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
      pvVar28 = programConfigs.
                super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar44 = (string *)
                programConfigs.
                super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    while (p_Var15 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left, uVar53 != 0) {
      glu::CallLogWrapper::glLinkProgram(this_00,pCVar45->name);
      pCVar45 = pCVar45 + 1;
      uVar53 = uVar53 - 1;
    }
    for (; (_Rb_tree_header *)p_Var15 != &shaders._M_t._M_impl.super__Rb_tree_header;
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      glu::CallLogWrapper::glDeleteShader(this_00,*(GLuint *)&p_Var15[3]._M_parent);
    }
    while (bVar6 = uVar52 != 0, uVar52 = uVar52 - 1, uVar34 = local_1698, bVar6) {
      glu::CallLogWrapper::glGetProgramiv(this_00,pCVar51->name,0x8b82,&status_1);
      glu::CallLogWrapper::glGetProgramInfoLog
                (this_00,pCVar51->name,1000,(GLsizei *)0x0,(GLchar *)&name);
      tcu::TestLog::writeCompileInfo
                (glcts::(anonymous_namespace)::Logger::s_tcuLog,"program",
                 fixed_sample_locations_values + 1,status_1 == 1,(char *)&name);
      if (negativeLink) {
        if (status_1 != 0) {
          Logger::Logger((Logger *)&name_1);
          if ((char)name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::operator<<((ostream *)
                            &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                            "Negative link case failed: program should not link, but GL_LINK_STATUS != 0"
                           );
          }
LAB_00bdc65e:
          Logger::~Logger((Logger *)&name_1);
          local_1698 = 0xffffffffffffffff;
        }
      }
      else if (status_1 != 1) {
        Logger::Logger((Logger *)&name_1);
        glcts::(anonymous_namespace)::Logger::operator<<
                  ((Logger *)&name_1,(char (*) [19])"Shader link failed");
        goto LAB_00bdc65e;
      }
      pCVar51 = pCVar51 + 1;
    }
  }
  std::
  map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
  ::~map(&shaders);
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::~vector(&programConfigs);
  uVar53 = 0;
  do {
    pCVar45 = programs.
              super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pCVar51 = programs.
              super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar52 = (long)programs.
                   super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)programs.
                   super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if ((((uVar34 != 0) || (uVar52 <= uVar53)) || (negativeLink)) || (negativeCompile)) {
      glu::CallLogWrapper::glUseProgram(this_00,0);
      paVar27 = extraout_RDX_00;
      pCVar30 = pCVar51;
      while (bVar6 = uVar52 != 0, uVar52 = uVar52 - 1, bVar6) {
        glu::CallLogWrapper::glDeleteProgram(this_00,pCVar30->name);
        pCVar30 = pCVar30 + 1;
        paVar27 = extraout_RDX_01;
      }
      if (pCVar45 != pCVar51) {
        std::
        _Destroy<glcts::(anonymous_namespace)::CompiledProgram*,glcts::(anonymous_namespace)::CompiledProgram>
                  (pCVar51,pCVar45,paVar27);
        programs.
        super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar51;
      }
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&vbo);
      glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&vao);
      std::
      vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
      ::~vector(&programs);
      std::__cxx11::string::~string((string *)&parentUniformName);
      return uVar34;
    }
    local_15c8 = uVar53;
    glu::CallLogWrapper::glUseProgram
              (this_00,programs.
                       super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar53].name);
    pCVar26 = pCVar51 + uVar53;
    lVar50 = 0;
    for (uVar34 = 0;
        pUVar1 = (local_16b0->
                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar34 < (ulong)(((long)(local_16b0->
                                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x1d8)
        ; uVar34 = uVar34 + 1) {
      setUniform(local_16a0,(Uniform *)((long)&(pUVar1->type).enumType + lVar50),pCVar26);
      lVar50 = lVar50 + 0x1d8;
    }
    local_1690 = (string *)&pCVar26->stages;
    psVar44 = (string *)0x0;
    while( true ) {
      puVar2 = (pCVar26->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((string *)
           ((long)(pCVar26->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= psVar44) ||
         ((local_16c8->
          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          )._M_impl.super__Vector_impl_data._M_finish ==
          (local_16c8->
          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          )._M_impl.super__Vector_impl_data._M_start)) break;
      local_1688 = psVar44;
      glu::CallLogWrapper::glGetProgramStageiv
                (this_00,pCVar26->name,puVar2[(long)psVar44],0x8e47,&numactive);
      if ((long)numactive != 0) {
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream &
             0xffffffff00000000);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&programConfigs,
                   (long)numactive,(value_type_conflict4 *)&name,(allocator_type *)&name_1);
        uVar34 = 0;
        while( true ) {
          pSVar35 = (local_16c8->
                    super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(local_16c8->
                             super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar35) / 0x168)
              <= uVar34) break;
          status = (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &local_1690->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start
                   [(long)local_1688];
          local_16a8 = uVar34;
          bVar6 = DefOccurence::occurs(&pSVar35[uVar34].defOccurence,status);
          if ((bVar6) && ((pSVar35[uVar34].used & 1U) != 0)) {
            local_16d0 = pSVar35 + uVar34;
            this_01 = &local_16d0->location;
            local_16c0 = (string *)&local_16d0->name;
            for (iVar46 = 0; iVar46 < local_16d0->arraySize; iVar46 = iVar46 + 1) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status_1,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1690);
              bVar6 = LayoutSpecifierBase::isImplicit
                                (&this_01->super_LayoutSpecifierBase,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status_1);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status_1);
              if (bVar6) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
                pSVar35 = local_16d0;
                std::operator<<((ostream *)&name,local_16c0);
                SubroutineUniform::streamArrayStr(pSVar35,&name,iVar46);
                GVar10 = status;
                GVar8 = pCVar26->name;
                std::__cxx11::stringbuf::str();
                uVar9 = glu::CallLogWrapper::glGetSubroutineUniformLocation
                                  (this_00,GVar8,GVar10,
                                   (GLchar *)
                                   CONCAT44(name_1.
                                            super_basic_ostream<char,_std::char_traits<char>_>.
                                            _vptr_basic_ostream._4_4_,
                                            (GLuint)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream));
                std::__cxx11::string::~string((string *)&name_1);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
              }
              else {
                uVar9 = (this_01->super_LayoutSpecifierBase).val + iVar46;
                pSVar35 = local_16d0;
              }
              if ((int)uVar9 < 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                              ,0x617,
                              "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setSubroutineUniform(const SubroutineUniform &, const CompiledProgram &, GLenum, std::vector<glw::GLuint> &)"
                             );
              }
              this_03 = SubroutineUniform::getSelectedFunction(pSVar35,iVar46);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&shaders,1,
                         (value_type_conflict4 *)&status,(allocator_type *)&name);
              bVar6 = LayoutSpecifierBase::isImplicit
                                ((LayoutSpecifierBase *)this_03,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&shaders);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&shaders);
              if (bVar6) {
                GVar8 = glu::CallLogWrapper::glGetSubroutineIndex
                                  (this_00,pCVar26->name,status,(this_03->name)._M_dataplus._M_p);
              }
              else {
                GVar8 = (this_03->index).super_LayoutSpecifierBase.val;
              }
              if ((int)((ulong)((long)programConfigs.
                                      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)programConfigs.
                                     super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) <= (int)uVar9)
              {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                              ,0x612,
                              "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setSubroutineUniform(const SubroutineUniform &, const CompiledProgram &, GLenum, std::vector<glw::GLuint> &)"
                             );
              }
              *(GLuint *)
               ((long)&((programConfigs.
                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                       )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar9 * 4) = GVar8;
            }
          }
          uVar34 = local_16a8 + 1;
        }
        glu::CallLogWrapper::glUniformSubroutinesuiv
                  (this_00,(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &local_1690->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start
                           [(long)local_1688],numactive,
                   (GLuint *)
                   programConfigs.
                   super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&programConfigs);
      }
      psVar44 = local_1688 + 1;
    }
    if (*puVar2 == 0x91b9) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&name_1);
      glu::CallLogWrapper::glBindBuffer
                (this_00,0x90d2,
                 (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(void *)0x0,0x88e9);
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x90d2,1,
                 (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
      pacVar36 = (char (*) [9])0x90d2;
      pfVar19 = (float *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
      if (((((*pfVar19 != 0.0) || (NAN(*pfVar19))) || (pfVar19[1] != 1.0)) ||
          ((NAN(pfVar19[1]) || (pfVar19[2] != 0.0)))) || (NAN(pfVar19[2]))) {
        Logger::Logger((Logger *)&name);
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar36);
        pCVar37 = pCVar26;
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,&pCVar26->name);
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [37])pCVar37);
        status_1 = (GLint)*pfVar19;
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,&status_1);
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x16e2e70);
        shaders._M_t._M_impl._0_4_ = (BADTYPE)pfVar19[1];
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)&shaders);
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x16e2e70);
        programConfigs.
        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(programConfigs.
                               super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)pfVar19[2]);
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)&programConfigs);
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x16e2e70);
        status = (GLint)pfVar19[3];
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,&status);
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x18bfd7b);
        Logger::~Logger((Logger *)&name);
        local_15e8 = 0xffffffffffffffff;
      }
      else {
        local_15e8 = 0;
      }
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&name_1);
    }
    else {
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      iVar46 = (*((local_16a0->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                 _vptr_RenderContext[4])();
      iVar46 = *(int *)CONCAT44(extraout_var,iVar46);
      iVar47 = (*((local_16a0->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                 _vptr_RenderContext[4])();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&name_1,
                 (long)(iVar46 * *(int *)(CONCAT44(extraout_var_00,iVar47) + 4) * 4),
                 (allocator_type *)&name);
      iVar46 = (*((local_16a0->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                 _vptr_RenderContext[4])();
      width = *(GLsizei *)CONCAT44(extraout_var_01,iVar46);
      iVar46 = (*((local_16a0->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                 _vptr_RenderContext[4])();
      pacVar36 = (char (*) [9])0x0;
      glu::CallLogWrapper::glReadPixels
                (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_02,iVar46) + 4),0x1908,0x1401,
                 (void *)CONCAT44(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream._4_4_,
                                  (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                          _vptr_basic_ostream));
      lVar50 = CONCAT44(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream._4_4_,
                        (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream);
      for (uVar34 = 0;
          uVar34 < (ulong)(name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ - lVar50)
          ; uVar34 = uVar34 + 4) {
        if (((*(char *)(lVar50 + uVar34) != '\0') || (*(char *)(lVar50 + 1 + uVar34) != -1)) ||
           (*(char *)(lVar50 + 2 + uVar34) != '\0')) {
          Logger::Logger((Logger *)&name);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar36);
          pCVar37 = pCVar26;
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,&pCVar26->name);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [37])pCVar37);
          status_1 = (GLint)*(byte *)(CONCAT44(name_1.
                                               super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream._4_4_,
                                               (GLuint)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream) + uVar34);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,&status_1);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x16e2e70);
          shaders._M_t._M_impl._0_4_ =
               ZEXT14(*(byte *)(CONCAT44(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream._4_4_,
                                         (GLuint)name_1.
                                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                                 _vptr_basic_ostream) + 1 + uVar34));
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)&shaders);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x16e2e70);
          programConfigs.
          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(programConfigs.
                                 super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (uint)*(byte *)(CONCAT44(name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream._4_4_,
                                                  (GLuint)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream) + 2 + uVar34));
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)&programConfigs);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x16e2e70);
          status = (GLint)*(byte *)(CONCAT44(name_1.
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream._4_4_,
                                             (GLuint)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream) + 3 + uVar34);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,&status);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x18bfd7b);
          Logger::~Logger((Logger *)&name);
          local_15e8 = 0xffffffffffffffff;
          goto LAB_00bdce21;
        }
      }
      local_15e8 = 0;
LAB_00bdce21:
      Logger::Logger((Logger *)&name);
      this_02 = glcts::(anonymous_namespace)::Logger::s_tcuLog;
      iVar46 = (*((local_16a0->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                 _vptr_RenderContext[4])();
      iVar46 = *(int *)CONCAT44(extraout_var_03,iVar46);
      iVar47 = (*((local_16a0->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                 _vptr_RenderContext[4])();
      tcu::TestLog::writeImage
                (this_02,"rendered image",fixed_sample_locations_values + 1,
                 QP_IMAGE_COMPRESSION_MODE_BEST,QP_IMAGE_FORMAT_RGBA8888,iVar46,
                 *(int *)(CONCAT44(extraout_var_04,iVar47) + 4),0,
                 (void *)CONCAT44(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream._4_4_,
                                  (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                          _vptr_basic_ostream));
      Logger::~Logger((Logger *)&name);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&name_1);
    }
    name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ & 0xffffffff00000000;
    name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
    name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
         &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
    name.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
    glu::CallLogWrapper::glGetIntegerv(this_00,0x826e,(GLint *)&name_1);
    lVar50 = 0;
    uVar34 = 0;
    for (uVar53 = 0;
        pUVar1 = (local_16b0->
                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar53 < (ulong)(((long)(local_16b0->
                                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x1d8)
        ; uVar53 = uVar53 + 1) {
      uVar52 = runQueryUniform(local_16a0,pCVar26,
                               (Uniform *)((long)&(pUVar1->type).enumType + lVar50),
                               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&name,(GLuint)name_1.
                                                super_basic_ostream<char,_std::char_traits<char>_>.
                                                _vptr_basic_ostream);
      uVar34 = uVar34 | uVar52;
      lVar50 = lVar50 + 0x1d8;
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&name);
    if ((local_16c8->
        super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (local_16c8->
        super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      local_1698 = uVar34;
      glu::CallLogWrapper::glGetIntegerv(this_00,0x8de8,&maxLocation);
      glu::CallLogWrapper::glGetIntegerv(this_00,0x8de7,&maxIndex);
      for (uVar53 = 0; uVar34 = local_1698,
          uVar53 < (ulong)((long)(pCVar26->stages).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pCVar26->stages).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2); uVar53 = uVar53 + 1
          ) {
        local_1580._0_4_ = _S_red;
        local_1580._8_8_ = 0;
        local_1580._16_8_ = local_1580;
        local_1560 = 0;
        shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &shaders._M_t._M_impl.super__Rb_tree_header._M_header;
        shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pSVar35 = (local_16c8->
                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar34 = 0;
        shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_15e0 = uVar53;
        local_1568 = (_Base_ptr)local_1580._16_8_;
        while (uVar53 = local_15e0,
              uVar34 < (ulong)(((long)(local_16c8->
                                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar35) /
                              0x168)) {
          numactive = (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &local_1690->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start
                      [local_15e0];
          uVar53 = uVar34 * 0x168;
          local_16d0 = pSVar35 + uVar34;
          returned_1 = maxLocation;
          local_1688 = (string *)&pSVar35[uVar34].name;
          local_15b0 = &pSVar35[uVar34].defOccurence;
          local_15b8 = &pSVar35[uVar34].location.super_LayoutSpecifierBase;
          iVar46 = 0;
          local_15d8 = maxLocation;
          if (maxLocation < 1) {
            local_15d8 = 0;
          }
          local_16c0 = (string *)0x0;
          local_16a8 = uVar53;
          local_15c0 = uVar34;
          for (; iVar46 < local_16d0->arraySize; iVar46 = iVar46 + 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_1);
            std::operator<<((ostream *)&name_1,local_1688);
            SubroutineUniform::streamArrayStr(local_16d0,&name_1,iVar46);
            GVar10 = numactive;
            GVar8 = pCVar26->name;
            std::__cxx11::stringbuf::str();
            GVar10 = glu::CallLogWrapper::glGetSubroutineUniformLocation
                               (this_00,GVar8,GVar10,
                                (GLchar *)
                                name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream);
            std::__cxx11::string::~string((string *)&name);
            returned = GVar10;
            if (numactive == 0x8b30) {
              GVar32 = 0x92f2;
            }
            else {
              GVar32 = 0x92ee;
              if (numactive != 0x8b31) {
                if (numactive != 0x91b9) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                ,0x70f,
                                "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::runQueryUniformSubroutine(const CompiledProgram &, GLenum, const SubroutineUniform &, std::set<GLuint> &, GLint)"
                               );
                }
                GVar32 = 0x92f3;
              }
            }
            GVar8 = pCVar26->name;
            std::__cxx11::stringbuf::str();
            GVar11 = glu::CallLogWrapper::glGetProgramResourceLocation
                               (this_00,GVar8,GVar32,
                                (GLchar *)
                                name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream);
            std::__cxx11::string::~string((string *)&name);
            returnedPIQ = GVar11;
            if (GVar10 != GVar11) {
              Logger::Logger((Logger *)&name);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [33])"Locations of subrutine uniform \"");
              std::__cxx11::stringbuf::str();
              pbVar38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &programConfigs;
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &programConfigs);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [84])pbVar38);
              pacVar39 = (char (*) [5])&returned;
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar39);
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar39);
              pacVar40 = (char (*) [2])&returnedPIQ;
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar40);
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar40);
              std::__cxx11::string::~string((string *)&programConfigs);
              Logger::~Logger((Logger *)&name);
              local_16c0 = (string *)0xffffffffffffffff;
            }
            bVar7 = DefOccurence::occurs(local_15b0,numactive);
            bVar6 = local_16d0->used;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status,1,
                       (value_type_conflict4 *)&numactive,(allocator_type *)&name);
            pLVar54 = local_15b8;
            bVar31 = bVar7 & bVar6;
            t = (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status;
            bVar6 = LayoutSpecifierBase::isImplicit
                              (local_15b8,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status);
            if (bVar6) {
              if (bVar31 == 0) goto LAB_00bdd470;
              iVar47 = GVar10;
              if (-1 < GVar10) goto LAB_00bdd3ab;
              Logger::Logger((Logger *)&name);
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [32])t);
              pbVar38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &programConfigs;
              std::__cxx11::stringbuf::str();
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pbVar38);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [42])pbVar38);
              pacVar40 = (char (*) [2])&returned;
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar40);
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar40);
              std::__cxx11::string::~string((string *)&programConfigs);
              Logger::~Logger((Logger *)&name);
              local_16c0 = (string *)0xffffffffffffffff;
              uVar53 = local_16a8;
            }
            else {
              iVar47 = pLVar54->val + iVar46;
              expected = iVar47;
              if ((iVar47 != GVar10) && (GVar10 != -1 || bVar31 != 0)) {
                Logger::Logger((Logger *)&name);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [32])t);
                std::__cxx11::stringbuf::str();
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &programConfigs);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [22])"\" location: expected ");
                pacVar41 = (char (*) [7])&expected;
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar41);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar41);
                pacVar40 = (char (*) [2])&returned;
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar40);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar40);
                std::__cxx11::string::~string((string *)&programConfigs);
                Logger::~Logger((Logger *)&name);
                local_16c0 = (string *)0xffffffffffffffff;
              }
              expected_1 = iVar47;
              if (-1 < iVar47) {
LAB_00bdd3ab:
                name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)
                     CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream._4_4_,iVar47);
                expected_1 = iVar47;
                iVar20 = std::
                         _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::find((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&status_1,(key_type *)&name);
                if (iVar20._M_node != (_Base_ptr)local_1580) {
                  Logger::Logger((Logger *)&name);
                  glcts::(anonymous_namespace)::Logger::operator<<
                            ((Logger *)&name,(char (*) [21])"Subroutine uniform \"");
                  std::__cxx11::stringbuf::str();
                  glcts::(anonymous_namespace)::Logger::operator<<
                            ((Logger *)&name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &programConfigs);
                  if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream == '\0') {
                    std::operator<<((ostream *)
                                    &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                     field_0x8,"\" location (");
                  }
                  pacVar42 = (char (*) [17])&expected_1;
                  glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar42);
                  glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar42);
                  std::__cxx11::string::~string((string *)&programConfigs);
                  Logger::~Logger((Logger *)&name);
                  local_16c0 = (string *)0xffffffffffffffff;
                }
                name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)
                     CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream._4_4_,iVar47);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_insert_unique<unsigned_int>
                          ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&status_1,(uint *)&name);
              }
LAB_00bdd470:
              uVar53 = local_16a8;
              if (local_15d8 <= GVar10) {
                Logger::Logger((Logger *)&name);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [21])"Subroutine uniform \"");
                std::__cxx11::stringbuf::str();
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &programConfigs);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [22])"\" returned location (");
                pacVar43 = (char (*) [51])&returned;
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar43);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar43);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,&returned_1);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [3])0x18bfd7b);
                std::__cxx11::string::~string((string *)&programConfigs);
                Logger::~Logger((Logger *)&name);
                local_16c0 = (string *)0xffffffffffffffff;
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_1);
          }
          local_1698 = local_1698 | (ulong)local_16c0;
          pSVar49 = (pointer)0x0;
          psVar44 = (string *)0x0;
          while( true ) {
            pSVar35 = (local_16c8->
                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar50 = *(long *)((long)&(pSVar35->functions).fn.
                                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar53);
            if ((string *)
                ((*(long *)((long)&(pSVar35->functions).fn.
                                   super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + uVar53) - lVar50) /
                0x108) <= psVar44) break;
            GVar32 = (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &local_1690->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start
                     [local_15e0];
            local_16c0 = (string *)CONCAT44(local_16c0._4_4_,maxIndex);
            local_1688 = psVar44;
            bVar6 = DefOccurence::occurs
                              ((DefOccurence *)((long)&(pSVar35->defOccurence).occurence + uVar53),
                               GVar32);
            if (bVar6) {
              bVar31 = (&((local_16c8->
                          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                          )._M_impl.super__Vector_impl_data._M_start)->used)[uVar53];
            }
            else {
              bVar31 = 0;
            }
            numactive = (GLint)local_16c0;
            status = GVar32;
            std::__cxx11::string::string
                      ((string *)&name_1,
                       (string *)
                       ((long)&(pSVar49->embeddedUIntUniform).type.childTypes.
                               super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar50));
            local_16d0 = pSVar49;
            GVar8 = glu::CallLogWrapper::glGetSubroutineIndex
                              (this_00,pCVar26->name,GVar32,
                               (GLchar *)
                               CONCAT44(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream._4_4_,
                                        (GLuint)name_1.
                                                super_basic_ostream<char,_std::char_traits<char>_>.
                                                _vptr_basic_ostream));
            returned_1 = GVar8;
            if (GVar32 == 0x8b30) {
              programInterface = 0x92ec;
            }
            else {
              programInterface = 0x92e8;
              if (GVar32 != 0x8b31) {
                if (GVar32 != 0x91b9) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                ,0x77c,
                                "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::runQueryUniformSubroutineFunction(const CompiledProgram &, GLenum, const SubroutineFunction &, std::set<GLuint> &, GLint, bool)"
                               );
                }
                programInterface = 0x92ed;
              }
            }
            returned = glu::CallLogWrapper::glGetProgramResourceIndex
                                 (this_00,pCVar26->name,programInterface,
                                  (GLchar *)
                                  CONCAT44(name_1.super_basic_ostream<char,_std::char_traits<char>_>
                                           ._vptr_basic_ostream._4_4_,
                                           (GLuint)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream));
            if (GVar8 == returned) {
              uVar34 = 0;
            }
            else {
              Logger::Logger((Logger *)&name);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [33])"Indices of subroutine function \"");
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &name_1);
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::operator<<((ostream *)
                                &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                                "\" returned by glGetSubroutineIndex and differ glGetProgramResourceIndex differ: "
                               );
              }
              pacVar39 = (char (*) [5])&returned_1;
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar39);
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar39);
              pacVar40 = (char (*) [2])&returned;
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar40);
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar40);
              Logger::~Logger((Logger *)&name);
              uVar34 = 0xffffffffffffffff;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&programConfigs,1,
                       (value_type_conflict4 *)&status,(allocator_type *)&name);
            pLVar54 = (LayoutSpecifierBase *)((long)&local_16d0->functions + lVar50);
            bVar6 = LayoutSpecifierBase::isImplicit
                              (pLVar54,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &programConfigs);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&programConfigs)
            ;
            uVar53 = local_16a8;
            if (bVar6) {
              if (bVar31 == 0) goto LAB_00bdd8e2;
              GVar33 = GVar8;
              if (-1 < (int)GVar8) goto LAB_00bdd850;
              Logger::Logger((Logger *)&name);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [33])"Unexpected subroutine function \"");
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &name_1);
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::operator<<((ostream *)
                                &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                                "\" index: expected positive value, got ");
              }
              pacVar40 = (char (*) [2])&returned_1;
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar40);
              glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar40);
              Logger::~Logger((Logger *)&name);
              uVar34 = 0xffffffffffffffff;
              pSVar35 = local_16d0;
            }
            else {
              GVar33 = pLVar54->val;
              expected_1 = GVar33;
              if (((~bVar31 & GVar8 == 0xffffffff) == 0) && (GVar33 != GVar8)) {
                Logger::Logger((Logger *)&name);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [33])"Unexpected subroutine function \"");
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &name_1);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [19])"\" index: expected ");
                pacVar41 = (char (*) [7])&expected_1;
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar41);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar41);
                pacVar40 = (char (*) [2])&returned_1;
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar40);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar40);
                Logger::~Logger((Logger *)&name);
                uVar34 = 0xffffffffffffffff;
              }
              returnedPIQ = GVar33;
              if (-1 < (int)GVar33) {
LAB_00bdd850:
                name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)
                     CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream._4_4_,GVar33);
                returnedPIQ = GVar33;
                iVar20 = std::
                         _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::find((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&shaders,(key_type *)&name);
                if ((_Rb_tree_header *)iVar20._M_node != &shaders._M_t._M_impl.super__Rb_tree_header
                   ) {
                  Logger::Logger((Logger *)&name);
                  glcts::(anonymous_namespace)::Logger::operator<<
                            ((Logger *)&name,(char (*) [22])"Subroutine function \"");
                  glcts::(anonymous_namespace)::Logger::operator<<
                            ((Logger *)&name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &name_1);
                  glcts::(anonymous_namespace)::Logger::operator<<
                            ((Logger *)&name,(char (*) [10])"\" index (");
                  pacVar42 = (char (*) [17])&returnedPIQ;
                  glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar42);
                  glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar42);
                  Logger::~Logger((Logger *)&name);
                  uVar34 = 0xffffffffffffffff;
                }
                name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)
                     CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream._4_4_,GVar33);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_insert_unique<unsigned_int>
                          ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&shaders,(uint *)&name);
              }
LAB_00bdd8e2:
              pSVar35 = local_16d0;
              if ((GLint)local_16c0 <= (int)GVar8 && -1 < (int)GVar8) {
                Logger::Logger((Logger *)&name);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [22])"Subroutine function \"");
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &name_1);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [19])"\" returned index (");
                pacVar43 = (char (*) [51])&returned_1;
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(int *)pacVar43);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,pacVar43);
                glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,&numactive);
                glcts::(anonymous_namespace)::Logger::operator<<
                          ((Logger *)&name,(char (*) [3])0x18bfd7b);
                Logger::~Logger((Logger *)&name);
                uVar34 = 0xffffffffffffffff;
              }
            }
            std::__cxx11::string::~string((string *)&name_1);
            local_1698 = local_1698 | uVar34;
            psVar44 = local_1688 + 1;
            pSVar49 = (pointer)&(pSVar35->embeddedUIntUniform).type.strType.field_2;
          }
          uVar34 = local_15c0 + 1;
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&shaders);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&status_1);
      }
    }
    uVar34 = uVar34 | local_15e8;
    uVar53 = local_15c8 + 1;
  } while( true );
}

Assistant:

long doRun(std::vector<Uniform>& uniforms, std::vector<SubroutineUniform>& subroutineUniforms,
			   std::string additionalDef = "", bool negativeCompile = false, bool negativeLink = false)
	{
		long		ret				  = NO_ERROR;
		std::string parentUniformName = "";
		for (size_t i = 0; i < uniforms.size(); i++)
		{
			std::ostringstream name;
			name << "u" << i;
			uniforms[i].setName(parentUniformName, name.str());
		}
		int subroutineTypeCounter	 = 0;
		int subroutineFunctionCounter = 0;
		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			std::ostringstream name;
			name << "u" << i + uniforms.size();
			subroutineUniforms[i].setName(name.str());
			if (!subroutineUniforms[i].functions.getTypeName().size())
			{
				subroutineUniforms[i].functions.setTypeName(subroutineTypeCounter++);
				for (size_t fn = 0; fn < subroutineUniforms[i].functions.fn.size(); fn++)
				{
					subroutineUniforms[i].functions.fn[fn].setName(subroutineFunctionCounter++);
				}
			}
		}

		GLfloat coords[] = {
			1.0f, -1.0f, 0.0f, 1.0f, 1.0f, 1.0f, 0.0f, 1.0f, -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
		};

		GLuint vbo, vao;
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(coords), coords, GL_STATIC_DRAW);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, NULL);
		glEnableVertexAttribArray(0);

		std::vector<CompiledProgram> programs;
		ret |= CreatePrograms(programs, uniforms, subroutineUniforms, additionalDef, negativeCompile, negativeLink);

		for (size_t i = 0; i < programs.size() && ret == NO_ERROR && !negativeCompile && !negativeLink; i++)
		{
			ret |= runExecuteProgram(programs[i], uniforms, subroutineUniforms);
			ret |= runQueryProgram(programs[i], uniforms, subroutineUniforms);
		}

		glUseProgram(0);

		DeletePrograms(programs);

		glDeleteBuffers(1, &vbo);
		glDeleteVertexArrays(1, &vao);

		return ret;
	}